

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::MemoryUsage(void)

{
  MallocCounter *pMVar1;
  FILE *pFVar2;
  Prog *pPVar3;
  bool bVar4;
  longlong lVar5;
  longlong lVar6;
  ostream *poVar7;
  PCRE *this;
  StringPiece *local_880;
  StringPiece local_838;
  undefined1 local_828 [8];
  RE2 re_3;
  undefined1 local_740 [7];
  MallocCounter mc_3;
  PCRE *re_2;
  undefined1 local_720 [7];
  MallocCounter mc_2;
  undefined1 local_710 [8];
  PCRE re_1;
  undefined1 local_6b8 [7];
  MallocCounter mc_1;
  StringPiece local_538;
  StringPiece local_528;
  undefined1 local_518 [8];
  StringPiece sp [4];
  LogMessage local_4d0;
  LogMessage local_350;
  Prog *local_1d0;
  Prog *prog;
  LogMessage local_1b8;
  StringPiece local_38;
  Regexp *local_28;
  Regexp *re;
  char *pcStack_18;
  MallocCounter mc;
  char *text;
  char *regexp;
  
  pcStack_18 = "650-253-0001";
  testing::MallocCounter::MallocCounter((MallocCounter *)((long)&re + 7),0);
  StringPiece::StringPiece(&local_38,"(\\d+)-(\\d+)-(\\d+)");
  local_28 = Regexp::Parse(&local_38,LikePerl,(RegexpStatus *)0x0);
  if (local_28 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x2f);
    poVar7 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar7,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
  }
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&re + 7));
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re + 7));
  fprintf(pFVar2,"Regexp: %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  testing::MallocCounter::Reset((MallocCounter *)((long)&re + 7));
  local_1d0 = Regexp::CompileToProg(local_28,0);
  if (local_1d0 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x36);
    poVar7 = LogMessage::stream(&local_350);
    std::operator<<(poVar7,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_350);
  }
  bVar4 = Prog::IsOnePass(local_1d0);
  if (!bVar4) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x37);
    poVar7 = LogMessage::stream(&local_4d0);
    std::operator<<(poVar7,"Check failed: prog->IsOnePass()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4d0);
  }
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&re + 7));
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re + 7));
  fprintf(pFVar2,"Prog:   %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  testing::MallocCounter::Reset((MallocCounter *)((long)&re + 7));
  local_880 = (StringPiece *)local_518;
  do {
    StringPiece::StringPiece(local_880);
    pPVar3 = local_1d0;
    local_880 = local_880 + 1;
  } while (local_880 != (StringPiece *)&sp[3].length_);
  StringPiece::StringPiece(&local_528,pcStack_18);
  StringPiece::StringPiece(&local_538,pcStack_18);
  bVar4 = Prog::SearchOnePass(pPVar3,&local_528,&local_538,kAnchored,kFullMatch,
                              (StringPiece *)local_518,4);
  if (!bVar4) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_6b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3c);
    poVar7 = LogMessage::stream((LogMessage *)local_6b8);
    std::operator<<(poVar7,
                    "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_6b8);
  }
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&re + 7));
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re + 7));
  fprintf(pFVar2,"Search: %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  pPVar3 = local_1d0;
  if (local_1d0 != (Prog *)0x0) {
    Prog::~Prog(local_1d0);
    operator_delete(pPVar3);
  }
  Regexp::Decref(local_28);
  pMVar1 = (MallocCounter *)((long)&re_1.hit_limit_ + 3);
  testing::MallocCounter::MallocCounter(pMVar1,0);
  PCRE::PCRE((PCRE *)local_710,"(\\d+)-(\\d+)-(\\d+)",EnabledCompileOptions);
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth(pMVar1);
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re_1.hit_limit_ + 3));
  fprintf(pFVar2,"RE:     %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  StringPiece::StringPiece((StringPiece *)local_720,pcStack_18);
  PCRE::FullMatchFunctor::operator()
            ((FullMatchFunctor *)&PCRE::FullMatch,(StringPiece *)local_720,(PCRE *)local_710,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args);
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&re_1.hit_limit_ + 3));
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re_1.hit_limit_ + 3));
  fprintf(pFVar2,"RE:     %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  PCRE::~PCRE((PCRE *)local_710);
  testing::MallocCounter::MallocCounter((MallocCounter *)((long)&re_2 + 7),0);
  this = (PCRE *)operator_new(0x50);
  PCRE::PCRE(this,"(\\d+)-(\\d+)-(\\d+)",EnabledCompileOptions);
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&re_2 + 7));
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re_2 + 7));
  fprintf(pFVar2,"PCRE*:  %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  StringPiece::StringPiece((StringPiece *)local_740,pcStack_18);
  PCRE::FullMatchFunctor::operator()
            ((FullMatchFunctor *)&PCRE::FullMatch,(StringPiece *)local_740,this,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args);
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth((MallocCounter *)((long)&re_2 + 7));
  lVar6 = testing::MallocCounter::PeakHeapGrowth((MallocCounter *)((long)&re_2 + 7));
  fprintf(pFVar2,"PCRE*:  %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  if (this != (PCRE *)0x0) {
    PCRE::~PCRE(this);
    operator_delete(this);
  }
  pMVar1 = (MallocCounter *)((long)&re_3.group_names_once_._M_once + 3);
  testing::MallocCounter::MallocCounter(pMVar1,0);
  RE2::RE2((RE2 *)local_828,"(\\d+)-(\\d+)-(\\d+)");
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth(pMVar1);
  lVar6 = testing::MallocCounter::PeakHeapGrowth
                    ((MallocCounter *)((long)&re_3.group_names_once_._M_once + 3));
  fprintf(pFVar2,"RE2:    %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  StringPiece::StringPiece(&local_838,pcStack_18);
  RE2::FullMatch<>(&local_838,(RE2 *)local_828);
  pFVar2 = _stderr;
  lVar5 = testing::MallocCounter::HeapGrowth
                    ((MallocCounter *)((long)&re_3.group_names_once_._M_once + 3));
  lVar6 = testing::MallocCounter::PeakHeapGrowth
                    ((MallocCounter *)((long)&re_3.group_names_once_._M_once + 3));
  fprintf(pFVar2,"RE2:    %7lld bytes (peak=%lld)\n",lVar5,lVar6);
  RE2::~RE2((RE2 *)local_828);
  fprintf(_stderr,"sizeof: PCRE=%d RE2=%d Prog=%d Inst=%d\n",0x50,0xe0,0x1b8,8);
  return;
}

Assistant:

void MemoryUsage() {
  const char* regexp = "(\\d+)-(\\d+)-(\\d+)";
  const char* text = "650-253-0001";
  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    // Can't pass mc.HeapGrowth() and mc.PeakHeapGrowth() to LOG(INFO) directly,
    // because LOG(INFO) might do a big allocation before they get evaluated.
    fprintf(stderr, "Regexp: %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    mc.Reset();

    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK(prog->IsOnePass());
    fprintf(stderr, "Prog:   %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    mc.Reset();

    StringPiece sp[4];
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    fprintf(stderr, "Search: %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    delete prog;
    re->Decref();
  }

  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);

    PCRE re(regexp, PCRE::UTF8);
    fprintf(stderr, "RE:     %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    PCRE::FullMatch(text, re);
    fprintf(stderr, "RE:     %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
  }

  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);

    PCRE* re = new PCRE(regexp, PCRE::UTF8);
    fprintf(stderr, "PCRE*:  %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    PCRE::FullMatch(text, *re);
    fprintf(stderr, "PCRE*:  %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    delete re;
  }

  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);

    RE2 re(regexp);
    fprintf(stderr, "RE2:    %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    RE2::FullMatch(text, re);
    fprintf(stderr, "RE2:    %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
  }

  fprintf(stderr, "sizeof: PCRE=%d RE2=%d Prog=%d Inst=%d\n",
          static_cast<int>(sizeof(PCRE)),
          static_cast<int>(sizeof(RE2)),
          static_cast<int>(sizeof(Prog)),
          static_cast<int>(sizeof(Prog::Inst)));
}